

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

cmSourceFile *
anon_unknown.dwarf_b14bbb::AddCustomCommand
          (cmLocalGenerator *lg,cmCommandOrigin origin,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  cmCustomCommandLine *pcVar1;
  cmCustomCommandLine *pcVar2;
  cmCustomCommandLine *pcVar3;
  pointer pcVar4;
  cmake *this;
  cmCommandOrigin origin_00;
  bool bVar5;
  byte bVar6;
  cmListFileBacktrace *bt;
  cmCustomCommandLines *pcVar7;
  string *psVar8;
  cmMakefile *this_00;
  cmCustomCommand *pcVar9;
  cmCustomCommandLines *pcVar10;
  size_type sVar11;
  string *psVar12;
  cmMakefile *this_01;
  cmMakefile *this_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view input;
  string simple;
  string outName;
  cmCryptoHash h;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigOutputs;
  string local_138;
  string local_118;
  cmCommandOrigin local_f4;
  cmMakefile *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_e0;
  string local_d8;
  cmGlobalGenerator *local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  cmCryptoHash local_a8;
  undefined1 local_98 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_88;
  string *local_58;
  string local_50;
  
  this_02 = lg->Makefile;
  local_f4 = origin;
  bt = cmCustomCommand::GetBacktrace
                 ((cc->_M_t).
                  super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
                  .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_e8 = cmCustomCommand::GetOutputs_abi_cxx11_
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_b0 = cmCustomCommand::GetByproducts_abi_cxx11_
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  pcVar7 = cmCustomCommand::GetCommandLines
                     ((cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_f0 = this_02;
  if (((pcVar7->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pcVar7->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     (pcVar9 = (cc->_M_t).
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
     pcVar9->HasMainDependency_ != true)) {
    this_01 = (cmMakefile *)0x0;
  }
  else {
    psVar8 = cmCustomCommand::GetMainDependency_abi_cxx11_(pcVar9);
    this_00 = (cmMakefile *)cmMakefile::GetSource(this_02,psVar8,Ambiguous);
    if (this_00 == (cmMakefile *)0x0) {
      this_01 = (cmMakefile *)cmMakefile::CreateSource(this_02,psVar8,false,Ambiguous);
      bVar6 = 1;
    }
    else {
      pcVar9 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_00);
      bVar6 = 1;
      this_01 = this_00;
      if (pcVar9 != (cmCustomCommand *)0x0 && !replace) {
        pcVar9 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_00);
        pcVar10 = cmCustomCommand::GetCommandLines(pcVar9);
        pcVar1 = (pcVar7->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar2 = (pcVar7->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pcVar3 = (pcVar10->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((long)pcVar2 - (long)pcVar1 ==
            (long)(pcVar10->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)
                  .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
          bVar5 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                            (pcVar1,pcVar2,pcVar3);
        }
        else {
          bVar5 = false;
        }
        this_01 = (cmMakefile *)0x0;
        if (bVar5 != false) {
          this_01 = this_00;
        }
        bVar6 = bVar5 ^ 1;
      }
    }
    this_02 = this_00;
    if (bVar6 == 0) {
      return (cmSourceFile *)this_00;
    }
  }
  if (this_01 != (cmMakefile *)0x0) goto LAB_002f1646;
  local_b8 = lg->GlobalGenerator;
  psVar8 = (local_e8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar11 = cmGeneratorExpression::Find(psVar8);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  pcVar4 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar4,pcVar4 + psVar8->_M_string_length);
  if (sVar11 != 0xffffffffffffffff) {
    cmsys::SystemTools::ReplaceString(&local_138,"$<CONFIG>","(CONFIG)");
    sVar11 = cmGeneratorExpression::Find(&local_138);
    if (sVar11 != 0xffffffffffffffff) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      cmLocalGenerator::ExpandCustomCommandOutputGenex
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98,lg,psVar8,bt);
      if (local_98._8_8_ - local_98._0_8_ == 0x20) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,*(long *)local_98._0_8_,
                   (long)&((*(pointer *)(local_98._0_8_ + 8))->CurrentScope).Tree +
                   *(long *)local_98._0_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
        cmCryptoHash::cmCryptoHash(&local_a8,AlgoSHA256);
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)local_98,&(lg->super_cmOutputConverter).StateSnapshot);
        psVar12 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_98);
        input._M_str = (psVar8->_M_dataplus)._M_p;
        input._M_len = psVar8->_M_string_length;
        cmCryptoHash::HashString_abi_cxx11_(&local_50,&local_a8,input);
        std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_50);
        local_98._8_8_ = (psVar12->_M_dataplus)._M_p;
        local_98._0_8_ = psVar12->_M_string_length;
        local_88.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc;
        local_88.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x8eb2e1;
        local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._M_string_length;
        local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_118._M_dataplus._M_p;
        views._M_len = 3;
        views._M_array = (iterator)local_98;
        local_58 = &local_118;
        cmCatViews(&local_138,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmCryptoHash::~cmCryptoHash(&local_a8);
      }
    }
  }
  (*local_b8->_vptr_cmGlobalGenerator[0x36])(&local_d8,local_b8,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  this_01 = (cmMakefile *)cmMakefile::GetSource(local_f0,&local_d8,Known);
  if (this_01 == (cmMakefile *)0x0) {
    this_01 = (cmMakefile *)cmMakefile::CreateSource(local_f0,&local_d8,true,Known);
LAB_002f1587:
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"__CMAKE_RULE","");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"1","");
    cmSourceFile::SetProperty((cmSourceFile *)this_01,(string *)local_98,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)local_88.Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    bVar5 = true;
  }
  else {
    pcVar9 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_01);
    if (pcVar9 == (cmCustomCommand *)0x0 || replace) goto LAB_002f1587;
    pcVar9 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_01);
    pcVar10 = cmCustomCommand::GetCommandLines(pcVar9);
    pcVar1 = (pcVar7->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (pcVar7->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar3 = (pcVar10->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)pcVar2 - (long)pcVar1 !=
         (long)(pcVar10->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)pcVar3) ||
       (bVar5 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                          (pcVar1,pcVar2,pcVar3), !bVar5)) {
      this = lg->GlobalGenerator->CMakeInstance;
      local_98._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x29;
      local_98._8_8_ = "Attempt to add a custom rule to output\n  ";
      local_88.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_string_length;
      local_88.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._M_dataplus._M_p;
      local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x21;
      local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x8b0cf1;
      local_58 = (string *)0x0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_98;
      cmCatViews(&local_118,views_00);
      cmake::IssueMessage(this,FATAL_ERROR,&local_118,bt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    bVar5 = false;
    this_02 = this_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    return (cmSourceFile *)this_02;
  }
LAB_002f1646:
  if (this_01 != (cmMakefile *)0x0) {
    cmCustomCommand::SetEscapeAllowMakeVars
              ((cc->_M_t).
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,true);
    origin_00 = local_f4;
    cmLocalGenerator::AddSourceOutputs(lg,(cmSourceFile *)this_01,local_e8,Primary,bt,local_f4);
    cmLocalGenerator::AddSourceOutputs(lg,(cmSourceFile *)this_01,local_b0,Byproduct,bt,origin_00);
    local_e0._M_head_impl =
         (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
         _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
    cmSourceFile::SetCustomCommand
              ((cmSourceFile *)this_01,
               (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_e0);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_e0);
  }
  return (cmSourceFile *)this_01;
}

Assistant:

cmSourceFile* AddCustomCommand(cmLocalGenerator& lg, cmCommandOrigin origin,
                               std::unique_ptr<cmCustomCommand> cc,
                               bool replace)
{
  cmMakefile* mf = lg.GetMakefile();
  const auto& lfbt = cc->GetBacktrace();
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && cc->HasMainDependency()) {
    const auto& main_dependency = cc->GetMainDependency();
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = mf->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = mf->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = lg.GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(
      ComputeCustomCommandRuleFileName(lg, lfbt, outputs[0]));

    // Check if the rule file already exists.
    file = mf->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        lg.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Attempt to add a custom rule to output\n  ", outName,
                   "\nwhich already has a custom rule."),
          lfbt);
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = mf->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Attach the custom command to the file.
  if (file) {
    cc->SetEscapeAllowMakeVars(true);

    lg.AddSourceOutputs(file, outputs, cmLocalGenerator::OutputRole::Primary,
                        lfbt, origin);
    lg.AddSourceOutputs(file, byproducts,
                        cmLocalGenerator::OutputRole::Byproduct, lfbt, origin);

    file->SetCustomCommand(std::move(cc));
  }
  return file;
}